

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_file.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::FileGenerator::GenerateTables(FileGenerator *this,Printer *printer)

{
  value_type pDVar1;
  bool bVar2;
  int iVar3;
  size_type sVar4;
  reference pvVar5;
  pointer pMVar6;
  ulong uVar7;
  reference pvVar8;
  size_type sVar9;
  reference ppDVar10;
  LogMessage *pLVar11;
  reference pvVar12;
  int local_188;
  LogFinisher local_182;
  byte local_181;
  LogMessage local_180;
  int local_148;
  LogFinisher local_142;
  byte local_141;
  int i_4;
  undefined1 local_108 [8];
  vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
  calculated_order;
  int i_3;
  int idx;
  vector<int,_std::allocator<int>_> field_metadata_offsets;
  size_t sStack_c8;
  int i_2;
  size_t aux_offset;
  size_t offset;
  size_t value_1;
  undefined1 local_a8 [4];
  int i_1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> aux_entries;
  size_t value;
  long lStack_80;
  int i;
  size_t count;
  vector<unsigned_long,_std::allocator<unsigned_long>_> entries;
  undefined1 local_50 [8];
  Formatter format;
  Printer *printer_local;
  FileGenerator *this_local;
  
  format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)printer;
  Formatter::Formatter((Formatter *)local_50,printer,&this->variables_);
  if (((this->options_).table_driven_parsing & 1U) != 0) {
    Formatter::operator()<>
              ((Formatter *)local_50,
               "PROTOBUF_CONSTEXPR_VAR ::$proto_ns$::internal::ParseTableField\n    const $tablename$::entries[] PROTOBUF_SECTION_VARIABLE(protodesc_cold) = {\n"
              );
    Formatter::Indent((Formatter *)local_50);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&count);
    lStack_80 = 0;
    for (value._4_4_ = 0;
        sVar4 = std::
                vector<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
                ::size(&this->message_generators_), (ulong)(long)value._4_4_ < sVar4;
        value._4_4_ = value._4_4_ + 1) {
      pvVar5 = std::
               vector<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
               ::operator[](&this->message_generators_,(long)value._4_4_);
      pMVar6 = std::
               unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>
               ::operator->(pvVar5);
      aux_entries.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)MessageGenerator::GenerateParseOffsets
                              (pMVar6,(Printer *)
                                      format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count)
      ;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&count,
                 (value_type_conflict2 *)
                 &aux_entries.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      lStack_80 = (long)aux_entries.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage + lStack_80;
    }
    if (lStack_80 == 0) {
      Formatter::operator()<>
                ((Formatter *)local_50,"{0, 0, 0, ::$proto_ns$::internal::kInvalidMask, 0, 0},\n");
    }
    Formatter::Outdent((Formatter *)local_50);
    Formatter::operator()<>
              ((Formatter *)local_50,
               "};\n\nPROTOBUF_CONSTEXPR_VAR ::$proto_ns$::internal::AuxiliaryParseTableField\n    const $tablename$::aux[] PROTOBUF_SECTION_VARIABLE(protodesc_cold) = {\n"
              );
    Formatter::Indent((Formatter *)local_50);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_a8);
    lStack_80 = 0;
    for (value_1._4_4_ = 0; uVar7 = (ulong)value_1._4_4_,
        sVar4 = std::
                vector<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
                ::size(&this->message_generators_), uVar7 < sVar4; value_1._4_4_ = value_1._4_4_ + 1
        ) {
      pvVar5 = std::
               vector<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
               ::operator[](&this->message_generators_,(long)value_1._4_4_);
      pMVar6 = std::
               unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>
               ::operator->(pvVar5);
      offset = MessageGenerator::GenerateParseAuxTable
                         (pMVar6,(Printer *)
                                 format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_a8,&offset);
      lStack_80 = offset + lStack_80;
    }
    if (lStack_80 == 0) {
      Formatter::operator()<>
                ((Formatter *)local_50,"::$proto_ns$::internal::AuxiliaryParseTableField(),\n");
    }
    Formatter::Outdent((Formatter *)local_50);
    Formatter::operator()<>
              ((Formatter *)local_50,
               "};\nPROTOBUF_CONSTEXPR_VAR ::$proto_ns$::internal::ParseTable const\n    $tablename$::schema[] PROTOBUF_SECTION_VARIABLE(protodesc_cold) = {\n"
              );
    Formatter::Indent((Formatter *)local_50);
    aux_offset = 0;
    sStack_c8 = 0;
    for (field_metadata_offsets.super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
        uVar7 = (ulong)field_metadata_offsets.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage._4_4_,
        sVar4 = std::
                vector<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
                ::size(&this->message_generators_), uVar7 < sVar4;
        field_metadata_offsets.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ =
             field_metadata_offsets.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
      pvVar5 = std::
               vector<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
               ::operator[](&this->message_generators_,
                            (long)field_metadata_offsets.
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage._4_4_);
      pMVar6 = std::
               unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>
               ::operator->(pvVar5);
      MessageGenerator::GenerateParseTable
                (pMVar6,(Printer *)format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 aux_offset,sStack_c8);
      pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&count,
                          (long)field_metadata_offsets.super__Vector_base<int,_std::allocator<int>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
      aux_offset = *pvVar8 + aux_offset;
      pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_a8,
                          (long)field_metadata_offsets.super__Vector_base<int,_std::allocator<int>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
      sStack_c8 = *pvVar8 + sStack_c8;
    }
    bVar2 = std::
            vector<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
            ::empty(&this->message_generators_);
    if (bVar2) {
      Formatter::operator()<>((Formatter *)local_50,"{ nullptr, nullptr, 0, -1, -1, false },\n");
    }
    Formatter::Outdent((Formatter *)local_50);
    Formatter::operator()<>((Formatter *)local_50,"};\n\n");
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_a8);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&count);
  }
  bVar2 = std::
          vector<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
          ::empty(&this->message_generators_);
  if ((!bVar2) && (((this->options_).table_driven_serialization & 1U) != 0)) {
    Formatter::operator()<>
              ((Formatter *)local_50,
               "const ::$proto_ns$::internal::FieldMetadata $tablename$::field_metadata[] = {\n");
    Formatter::Indent((Formatter *)local_50);
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)&i_3);
    calculated_order.
    super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
    for (calculated_order.
         super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
        uVar7 = (ulong)(int)calculated_order.
                            super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,
        sVar4 = std::
                vector<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
                ::size(&this->message_generators_), uVar7 < sVar4;
        calculated_order.
        super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
             (int)calculated_order.
                  super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) {
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)&i_3,
                 (value_type_conflict *)
                 ((long)&calculated_order.
                         super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
      pvVar5 = std::
               vector<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
               ::operator[](&this->message_generators_,
                            (long)(int)calculated_order.
                                       super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
      pMVar6 = std::
               unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>
               ::operator->(pvVar5);
      iVar3 = MessageGenerator::GenerateFieldMetadata
                        (pMVar6,(Printer *)
                                format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
      calculated_order.
      super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
           iVar3 + calculated_order.
                   super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
    }
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)&i_3,
               (value_type_conflict *)
               ((long)&calculated_order.
                       super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
    Formatter::Outdent((Formatter *)local_50);
    Formatter::operator()<>
              ((Formatter *)local_50,
               "};\nconst ::$proto_ns$::internal::SerializationTable $tablename$::serialization_table[] = {\n"
              );
    Formatter::Indent((Formatter *)local_50);
    FlattenMessagesInFile
              ((vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                *)local_108,this->file_);
    sVar4 = std::
            vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
            ::size((vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                    *)local_108);
    sVar9 = std::
            vector<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
            ::size(&this->message_generators_);
    local_141 = 0;
    if (sVar4 != sVar9) {
      internal::LogMessage::LogMessage
                ((LogMessage *)&i_4,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_file.cc"
                 ,999);
      local_141 = 1;
      pLVar11 = internal::LogMessage::operator<<
                          ((LogMessage *)&i_4,
                           "CHECK failed: (calculated_order.size()) == (message_generators_.size()): "
                          );
      internal::LogFinisher::operator=(&local_142,pLVar11);
    }
    if ((local_141 & 1) != 0) {
      internal::LogMessage::~LogMessage((LogMessage *)&i_4);
    }
    for (local_148 = 0; uVar7 = (ulong)local_148,
        sVar4 = std::
                vector<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
                ::size(&this->message_generators_), uVar7 < sVar4; local_148 = local_148 + 1) {
      ppDVar10 = std::
                 vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                 ::operator[]((vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                               *)local_108,(long)local_148);
      pDVar1 = *ppDVar10;
      pvVar5 = std::
               vector<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
               ::operator[](&this->message_generators_,(long)local_148);
      pMVar6 = std::
               unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>
               ::operator->(pvVar5);
      local_181 = 0;
      if (pDVar1 != pMVar6->descriptor_) {
        internal::LogMessage::LogMessage
                  (&local_180,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_file.cc"
                   ,0x3e9);
        local_181 = 1;
        pLVar11 = internal::LogMessage::operator<<
                            (&local_180,
                             "CHECK failed: (calculated_order[i]) == (message_generators_[i]->descriptor_): "
                            );
        internal::LogFinisher::operator=(&local_182,pLVar11);
      }
      if ((local_181 & 1) != 0) {
        internal::LogMessage::~LogMessage(&local_180);
      }
      pvVar12 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)&i_3,(long)(local_148 + 1));
      iVar3 = *pvVar12;
      pvVar12 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)&i_3,(long)local_148);
      local_188 = iVar3 - *pvVar12;
      pvVar12 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)&i_3,(long)local_148);
      Formatter::operator()
                ((Formatter *)local_50,"{$1$, $tablename$::field_metadata + $2$},\n",&local_188,
                 pvVar12);
    }
    Formatter::Outdent((Formatter *)local_50);
    Formatter::operator()<>((Formatter *)local_50,"};\n\n");
    std::
    vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
    ::~vector((vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
               *)local_108);
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&i_3);
  }
  Formatter::~Formatter((Formatter *)local_50);
  return;
}

Assistant:

void FileGenerator::GenerateTables(io::Printer* printer) {
  Formatter format(printer, variables_);
  if (options_.table_driven_parsing) {
    // TODO(ckennelly): Gate this with the same options flag to enable
    // table-driven parsing.
    format(
        "PROTOBUF_CONSTEXPR_VAR ::$proto_ns$::internal::ParseTableField\n"
        "    const $tablename$::entries[] "
        "PROTOBUF_SECTION_VARIABLE(protodesc_cold) = {\n");
    format.Indent();

    std::vector<size_t> entries;
    size_t count = 0;
    for (int i = 0; i < message_generators_.size(); i++) {
      size_t value = message_generators_[i]->GenerateParseOffsets(printer);
      entries.push_back(value);
      count += value;
    }

    // We need these arrays to exist, and MSVC does not like empty arrays.
    if (count == 0) {
      format("{0, 0, 0, ::$proto_ns$::internal::kInvalidMask, 0, 0},\n");
    }

    format.Outdent();
    format(
        "};\n"
        "\n"
        "PROTOBUF_CONSTEXPR_VAR "
        "::$proto_ns$::internal::AuxiliaryParseTableField\n"
        "    const $tablename$::aux[] "
        "PROTOBUF_SECTION_VARIABLE(protodesc_cold) = {\n");
    format.Indent();

    std::vector<size_t> aux_entries;
    count = 0;
    for (int i = 0; i < message_generators_.size(); i++) {
      size_t value = message_generators_[i]->GenerateParseAuxTable(printer);
      aux_entries.push_back(value);
      count += value;
    }

    if (count == 0) {
      format("::$proto_ns$::internal::AuxiliaryParseTableField(),\n");
    }

    format.Outdent();
    format(
        "};\n"
        "PROTOBUF_CONSTEXPR_VAR ::$proto_ns$::internal::ParseTable const\n"
        "    $tablename$::schema[] "
        "PROTOBUF_SECTION_VARIABLE(protodesc_cold) = {\n");
    format.Indent();

    size_t offset = 0;
    size_t aux_offset = 0;
    for (int i = 0; i < message_generators_.size(); i++) {
      message_generators_[i]->GenerateParseTable(printer, offset, aux_offset);
      offset += entries[i];
      aux_offset += aux_entries[i];
    }

    if (message_generators_.empty()) {
      format("{ nullptr, nullptr, 0, -1, -1, false },\n");
    }

    format.Outdent();
    format(
        "};\n"
        "\n");
  }

  if (!message_generators_.empty() && options_.table_driven_serialization) {
    format(
        "const ::$proto_ns$::internal::FieldMetadata "
        "$tablename$::field_metadata[] "
        "= {\n");
    format.Indent();
    std::vector<int> field_metadata_offsets;
    int idx = 0;
    for (int i = 0; i < message_generators_.size(); i++) {
      field_metadata_offsets.push_back(idx);
      idx += message_generators_[i]->GenerateFieldMetadata(printer);
    }
    field_metadata_offsets.push_back(idx);
    format.Outdent();
    format(
        "};\n"
        "const ::$proto_ns$::internal::SerializationTable "
        "$tablename$::serialization_table[] = {\n");
    format.Indent();
    // We rely on the order we layout the tables to match the order we
    // calculate them with FlattenMessagesInFile, so we check here that
    // these match exactly.
    std::vector<const Descriptor*> calculated_order =
        FlattenMessagesInFile(file_);
    GOOGLE_CHECK_EQ(calculated_order.size(), message_generators_.size());
    for (int i = 0; i < message_generators_.size(); i++) {
      GOOGLE_CHECK_EQ(calculated_order[i], message_generators_[i]->descriptor_);
      format("{$1$, $tablename$::field_metadata + $2$},\n",
             field_metadata_offsets[i + 1] - field_metadata_offsets[i],  // 1
             field_metadata_offsets[i]);                                 // 2
    }
    format.Outdent();
    format(
        "};\n"
        "\n");
  }
}